

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferMapUnsyncWriteCase::iterate(BufferMapUnsyncWriteCase *this)

{
  RenderContext *renderCtx;
  bool bVar1;
  deUint32 seed;
  deUint32 buffer;
  uint uVar2;
  GLenum GVar3;
  deBool dVar4;
  uint uVar5;
  TestLog *log;
  char *pcVar6;
  deUint8 *pdVar7;
  void *dst;
  TestError *this_00;
  size_t in_R9;
  void *ptr;
  int size;
  undefined1 local_90 [3];
  bool isOk;
  deUint32 buf;
  ReferenceBuffer refBuf;
  undefined1 local_60 [4];
  deUint32 dataSeed;
  VertexArrayVerifier verifier;
  BufferMapUnsyncWriteCase *this_local;
  
  renderCtx = (this->super_BufferCase).m_renderCtx;
  verifier._72_8_ = this;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
            ((VertexArrayVerifier *)local_60,renderCtx,log);
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar6);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_90);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_90,0x4b0);
  pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_90,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar7,0x4b0,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  GVar3 = this->m_bufferTarget;
  pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_90,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar3,0x4b0,pdVar7,this->m_usage);
  pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_90,0);
  uVar2 = deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
                    ((VertexArrayVerifier *)local_60,(EVP_PKEY_CTX *)(ulong)buffer,pdVar7,0,
                     (uchar *)0x4b0,in_R9);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  dst = glu::CallLogWrapper::glMapBufferRange
                  (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,0,0x4b0,0x22)
  ;
  GVar3 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar3,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x1bc);
  while ((dVar4 = ::deGetFalse(), dVar4 == 0 && (dst != (void *)0x0))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_90,0);
      deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar7,0x4b0,seed & 0xabcdef);
      pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_90,0);
      ::deMemcpy(dst,pdVar7,0x4b0);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar3 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar3,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x1c3);
      glu::CallLogWrapper::glFinish(&(this->super_BufferCase).super_CallLogWrapper);
      pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_90,0);
      uVar5 = deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
                        ((VertexArrayVerifier *)local_60,(EVP_PKEY_CTX *)(ulong)buffer,pdVar7,0,
                         (uchar *)0x4b0,in_R9);
      bVar1 = (uVar5 & 1) != 0 && (uVar2 & 1) != 0;
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
      pcVar6 = "Buffer verification failed";
      if (bVar1) {
        pcVar6 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar1
                 ,pcVar6);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_90);
      deqp::gls::BufferTestUtil::VertexArrayVerifier::~VertexArrayVerifier
                ((VertexArrayVerifier *)local_60);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x1bd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		VertexArrayVerifier	verifier	(m_renderCtx, m_testCtx.getLog());
		deUint32			dataSeed	= deStringHash(getName());
		ReferenceBuffer		refBuf;
		deUint32			buf			= 0;
		bool				isOk		= true;
		const int			size		= 1200;

		// Setup reference data.
		refBuf.setSize(size);
		fillWithRandomBytes(refBuf.getPtr(), size, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, size, refBuf.getPtr(), m_usage);

		// Use for rendering.
		if (!verifier.verify(buf, refBuf.getPtr(), 0, size))
			isOk = false;
		// \note ReadPixels() implies Finish

		glBindBuffer(m_bufferTarget, buf);
		void* ptr = glMapBufferRange(m_bufferTarget, 0, size, GL_MAP_WRITE_BIT|GL_MAP_UNSYNCHRONIZED_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		fillWithRandomBytes(refBuf.getPtr(), size, dataSeed&0xabcdef);
		deMemcpy(ptr, refBuf.getPtr(), size);

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		// Synchronize.
		glFinish();

		if (!verifier.verify(buf, refBuf.getPtr(), 0, size))
			isOk = false;

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}